

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O0

int BN_mod_lshift1_quick(BIGNUM *r,BIGNUM *a,BIGNUM *m)

{
  int iVar1;
  undefined4 local_4;
  
  iVar1 = BN_lshift1(r,a);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = BN_cmp(r,m);
    if (iVar1 < 0) {
      local_4 = 1;
    }
    else {
      local_4 = BN_sub(r,r,m);
    }
  }
  return local_4;
}

Assistant:

int BN_mod_lshift1_quick(BIGNUM *r, const BIGNUM *a, const BIGNUM *m)
{
    if (!BN_lshift1(r, a))
        return 0;
    bn_check_top(r);
    if (BN_cmp(r, m) >= 0)
        return BN_sub(r, r, m);
    return 1;
}